

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLObjectWrapper.hpp
# Opt level: O0

void __thiscall
GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::Create
          (GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *this)

{
  Char *pCVar1;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_uiHandle != 0) {
    Diligent::FormatString<char[33]>
              ((string *)local_30,(char (*) [33])"GL object is already initialized");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLObjectWrapper.hpp"
               ,0x5a);
    std::__cxx11::string::~string((string *)local_30);
  }
  Release(this);
  GLBufferObjCreateReleaseHelper::Create(&this->m_CreateReleaseHelper,&this->m_uiHandle);
  if (this->m_uiHandle == 0) {
    Diligent::FormatString<char[31]>
              ((string *)local_60,(char (*) [31])"Failed to initialize GL object");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLObjectWrapper.hpp"
               ,0x5d);
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

void Create()
    {
        VERIFY(m_uiHandle == 0, "GL object is already initialized");
        Release();
        m_CreateReleaseHelper.Create(m_uiHandle);
        VERIFY(m_uiHandle, "Failed to initialize GL object");
    }